

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

int lua_load(lua_State *L,lua_Reader reader,void *data,char *chunkname,char *mode)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  int iVar4;
  char *name;
  ZIO z;
  ZIO local_50;
  
  name = "?";
  if (chunkname != (char *)0x0) {
    name = chunkname;
  }
  luaZ_init(L,&local_50,reader,data);
  iVar4 = luaD_protectedparser(L,&local_50,name,mode);
  if ((iVar4 == 0) && (lVar1 = *(long *)((L->top).offset + -0x10), *(char *)(lVar1 + 10) != '\0')) {
    lVar2 = *(long *)((L->l_G->l_registry).value_.f + 0x10);
    puVar3 = *(undefined8 **)(*(long *)(lVar1 + 0x20) + 0x10);
    *puVar3 = *(undefined8 *)(lVar2 + 0x10);
    *(undefined1 *)(puVar3 + 1) = *(undefined1 *)(lVar2 + 0x18);
    if (((*(byte *)(lVar2 + 0x18) & 0x40) != 0) &&
       ((((*(GCObject **)(lVar1 + 0x20))->marked & 0x20) != 0 &&
        (((*(GCObject **)(lVar2 + 0x10))->marked & 0x18) != 0)))) {
      luaC_barrier_(L,*(GCObject **)(lVar1 + 0x20),*(GCObject **)(lVar2 + 0x10));
    }
  }
  return iVar4;
}

Assistant:

LUA_API int lua_load (lua_State *L, lua_Reader reader, void *data,
                      const char *chunkname, const char *mode) {
  ZIO z;
  int status;
  lua_lock(L);
  if (!chunkname) chunkname = "?";
  luaZ_init(L, &z, reader, data);
  status = luaD_protectedparser(L, &z, chunkname, mode);
  if (status == LUA_OK) {  /* no errors? */
    LClosure *f = clLvalue(s2v(L->top.p - 1));  /* get new function */
    if (f->nupvalues >= 1) {  /* does it have an upvalue? */
      /* get global table from registry */
      const TValue *gt = getGtable(L);
      /* set global table as 1st upvalue of 'f' (may be LUA_ENV) */
      setobj(L, f->upvals[0]->v.p, gt);
      luaC_barrier(L, f->upvals[0], gt);
    }
  }
  lua_unlock(L);
  return status;
}